

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::next_semiintersection
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
           *this)

{
  bool bVar1;
  iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
  *piVar2;
  reference pcVar3;
  reference pcVar4;
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  local_50;
  iterator_range<std::_List_iterator<char>_> *local_48;
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  local_40;
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  local_38;
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  local_30;
  iterator_range<std::_List_iterator<char>_> *local_28;
  outer_range_iterator local_20;
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  local_18;
  outer_range_iterator skipped_until;
  semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
  *this_local;
  
  skipped_until._M_current = (iterator_range<std::_List_iterator<char>_> *)this;
  while( true ) {
    bVar1 = is_end(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_20._M_current = (this->m_begin)._M_current;
    local_28 = (iterator_range<std::_List_iterator<char>_> *)semiintersection_candidate(this);
    local_18._M_current =
         (iterator_range<std::_List_iterator<char>_> *)
         skip_while_less(this,local_20,(outer_range_iterator)local_28);
    local_30._M_current =
         (iterator_range<std::_List_iterator<char>_> *)semiintersection_candidate(this);
    bVar1 = __gnu_cxx::operator==(&local_18,&local_30);
    if (bVar1) break;
    piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
              *)__gnu_cxx::
                __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
                ::operator->(&local_18);
    bVar1 = boost::iterator_range_detail::
            iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
            ::empty(piVar2);
    if (bVar1) {
      local_48 = local_18._M_current;
      drop_empty_range(this,(outer_range_iterator)local_18._M_current);
    }
    else {
      local_50._M_current =
           (iterator_range<std::_List_iterator<char>_> *)semiintersection_candidate(this);
      piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                *)__gnu_cxx::
                  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
                  ::operator->(&local_50);
      pcVar3 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar2);
      piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                *)__gnu_cxx::
                  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
                  ::operator->(&local_18);
      pcVar4 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar2);
      bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x18,pcVar3,pcVar4);
      if (!bVar1) {
        __assert_fail("m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0x103,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                     );
      }
      maintain_invariant(this);
    }
  }
  piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
            *)__gnu_cxx::
              __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
              ::operator->(&local_18);
  pcVar3 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front(piVar2);
  local_38._M_current =
       (iterator_range<std::_List_iterator<char>_> *)semiintersection_candidate(this);
  piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
            *)__gnu_cxx::
              __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
              ::operator->(&local_38);
  pcVar4 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front(piVar2);
  bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x18,pcVar3,pcVar4);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("not m_compare(skipped_until->front(), semiintersection_candidate()->front())",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0xf9,
                  "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                 );
  }
  local_40._M_current =
       (iterator_range<std::_List_iterator<char>_> *)semiintersection_candidate(this);
  piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
            *)__gnu_cxx::
              __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
              ::operator->(&local_40);
  pcVar3 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front(piVar2);
  piVar2 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
            *)__gnu_cxx::
              __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
              ::operator->(&local_18);
  pcVar4 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front(piVar2);
  bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x18,pcVar3,pcVar4);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return;
  }
  __assert_fail("not m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0xfa,
                "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
               );
}

Assistant:

void next_semiintersection ()
        {
            while (not is_end())
            {
                auto skipped_until = skip_while_less(m_begin, semiintersection_candidate());
                if (skipped_until == semiintersection_candidate())
                {
                    BOOST_ASSERT(not m_compare(skipped_until->front(), semiintersection_candidate()->front()));
                    BOOST_ASSERT(not m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    break; // Полупересечение найдено.
                }
                else if (skipped_until->empty())
                {
                    drop_empty_range(skipped_until);
                }
                else // Текущий диапазон больше кандидата.
                {
                    BOOST_ASSERT(m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    maintain_invariant();
                }
            }
        }